

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# action.h
# Opt level: O0

void __thiscall re2c::Action::clear(Action *this)

{
  Action *this_local;
  
  if (((this->type != MATCH) && (this->type == INITIAL)) && ((this->info).initial != (Initial *)0x0)
     ) {
    operator_delete((this->info).initial,8);
  }
  return;
}

Assistant:

void clear ()
	{
		switch (type)
		{
			case INITIAL:
				delete info.initial;
				break;
			case MATCH:
			case SAVE:
			case MOVE:
			case ACCEPT:
			case RULE:
				break;
		}
	}